

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C1540.cpp
# Opt level: O0

void __thiscall Commodore::C1540::SerialPortVIA::update_data_line(SerialPortVIA *this)

{
  bool bVar1;
  element_type *this_00;
  bool local_39;
  undefined1 local_20 [8];
  shared_ptr<Commodore::Serial::Port> serialPort;
  SerialPortVIA *this_local;
  
  serialPort.super___shared_ptr<Commodore::Serial::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::weak_ptr<Commodore::Serial::Port>::lock((weak_ptr<Commodore::Serial::Port> *)local_20);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_20);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<Commodore::Serial::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Commodore::Serial::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_20);
    local_39 = false;
    if ((this->data_level_output_ & 1U) == 0) {
      local_39 = (this->attention_level_input_ & 1U) != (this->attention_acknowledge_level_ & 1U);
    }
    Serial::Port::set_output(this_00,Data,local_39);
  }
  std::shared_ptr<Commodore::Serial::Port>::~shared_ptr
            ((shared_ptr<Commodore::Serial::Port> *)local_20);
  return;
}

Assistant:

void SerialPortVIA::update_data_line() {
	std::shared_ptr<::Commodore::Serial::Port> serialPort = serial_port_.lock();
	if(serialPort) {
		// "ATN (Attention) is an input on pin 3 of P2 and P3 that is sensed at PB7 and CA1 of UC3 after being inverted by UA1"
		serialPort->set_output(::Commodore::Serial::Line::Data,
			::Commodore::Serial::LineLevel(!data_level_output_ && (attention_level_input_ != attention_acknowledge_level_)));
	}
}